

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Cluster::CreateSimpleBlock(Cluster *this,longlong st,longlong sz)

{
  BlockEntry **ppBVar1;
  ulong uVar2;
  BlockEntry *pBVar3;
  long lVar4;
  
  ppBVar1 = this->m_entries;
  if (ppBVar1 == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c91,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (this->m_entries_size < 1) {
    __assert_fail("m_entries_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c92,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  uVar2 = this->m_entries_count;
  if ((long)uVar2 < 0) {
    __assert_fail("m_entries_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c93,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (uVar2 < (ulong)this->m_entries_size) {
    pBVar3 = (BlockEntry *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    if (pBVar3 == (BlockEntry *)0x0) {
      ppBVar1[uVar2] = (BlockEntry *)0x0;
      lVar4 = -1;
    }
    else {
      pBVar3->m_pCluster = this;
      pBVar3->m_index = uVar2;
      pBVar3->_vptr_BlockEntry = (_func_int **)&PTR__SimpleBlock_00124c48;
      pBVar3[1]._vptr_BlockEntry = (_func_int **)st;
      pBVar3[1].m_pCluster = (Cluster *)sz;
      pBVar3[1].m_index = 0;
      *(undefined2 *)&pBVar3[2]._vptr_BlockEntry = 0xffff;
      *(undefined1 *)((long)&pBVar3[2]._vptr_BlockEntry + 2) = 0;
      pBVar3[2].m_pCluster = (Cluster *)0x0;
      *(undefined4 *)&pBVar3[2].m_index = 0xffffffff;
      pBVar3[3]._vptr_BlockEntry = (_func_int **)0x0;
      ppBVar1[uVar2] = pBVar3;
      lVar4 = Block::Parse((Block *)(pBVar3 + 1),this);
      if (lVar4 == 0) {
        this->m_entries_count = this->m_entries_count + 1;
        lVar4 = 0;
      }
      else {
        if (ppBVar1[uVar2] != (BlockEntry *)0x0) {
          (*ppBVar1[uVar2]->_vptr_BlockEntry[1])();
        }
        ppBVar1[uVar2] = (BlockEntry *)0x0;
      }
    }
    return lVar4;
  }
  __assert_fail("m_entries_count < m_entries_size",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1c94,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
}

Assistant:

long Cluster::CreateSimpleBlock(long long st, long long sz) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow) SimpleBlock(this, idx, st, sz);

  if (pEntry == NULL)
    return -1;  // generic error

  SimpleBlock* const p = static_cast<SimpleBlock*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}